

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost12sum.c
# Opt level: O0

int get_line(FILE *f,char *hash,char *filename,int verbose,int *size)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int in_ECX;
  char *in_RDX;
  void *in_RSI;
  FILE *in_RDI;
  int *in_R8;
  bool bVar4;
  char *spacepos;
  char *ptr;
  int len;
  int i;
  char *local_40;
  int local_38;
  int local_34;
  
  while( true ) {
    iVar1 = feof(in_RDI);
    if (iVar1 != 0) {
      return 0;
    }
    pcVar2 = fgets(in_RDX,0x1000,in_RDI);
    local_40 = in_RDX;
    if (pcVar2 == (char *)0x0) break;
    for (; *local_40 == ' '; local_40 = local_40 + 1) {
    }
    sVar3 = strlen(local_40);
    local_38 = (int)sVar3;
    while( true ) {
      local_38 = local_38 + -1;
      bVar4 = true;
      if (local_40[local_38] != '\n') {
        bVar4 = local_40[local_38] == '\r';
      }
      if (!bVar4) break;
      local_40[local_38] = '\0';
    }
    if (((local_38 != 0) && (pcVar2 = strchr(local_40,0x20), pcVar2 != (char *)0x0)) &&
       (sVar3 = strlen(pcVar2 + 1), sVar3 != 0)) {
      *in_R8 = (int)pcVar2 - (int)local_40;
      local_34 = 0;
      while( true ) {
        if (*in_R8 <= local_34) {
          if ((*in_R8 < 0x81) && ((*in_R8 == 0x40 || (*in_R8 == 0x80)))) {
            memcpy(in_RSI,local_40,(long)*in_R8);
            *(undefined1 *)((long)in_RSI + (long)*in_R8) = 0;
          }
          else {
            *in_R8 = 0;
            memset(in_RSI,0,0x81);
          }
          sVar3 = strlen(pcVar2);
          memmove(in_RDX,pcVar2 + 1,sVar3);
          *in_R8 = *in_R8 / 2;
          return 1;
        }
        if ((((local_40[local_34] < '0') ||
             (('9' < local_40[local_34] && (local_40[local_34] < 'A')))) ||
            (('F' < local_40[local_34] && (local_40[local_34] < 'a')))) ||
           ('f' < local_40[local_34])) break;
        local_34 = local_34 + 1;
      }
    }
    if (in_ECX != 0) {
      printf("Skipping line %s\n",in_RDX);
    }
  }
  return 0;
}

Assistant:

int get_line(FILE *f, char *hash, char *filename, int verbose, int *size)
{
    int i, len;
    char *ptr = filename;
    char *spacepos = NULL;

    while (!feof(f)) {
        if (!fgets(filename, PATH_MAX, f))
            return 0;
        ptr = filename;
        while (*ptr == ' ')
            ptr++;

        len = strlen(ptr);
        while (ptr[--len] == '\n' || ptr[len] == '\r')
            ptr[len] = 0;

        if (len == 0)
            goto nextline;

        spacepos = strchr(ptr, ' ');
        if (spacepos == NULL || strlen(spacepos + 1) == 0)
            goto nextline;

        *size = spacepos - ptr;

        for (i = 0; i < *size; i++) {
            if (ptr[i] < '0' || (ptr[i] > '9' && ptr[i] < 'A') ||
                (ptr[i] > 'F' && ptr[i] < 'a') || ptr[i] > 'f') {
                goto nextline;
            }
        }

        if (*size > 128 || ((*size != 64) && (*size != 128))) {
            *size = 0;
            memset(hash, 0, MAX_HASH_TXT_BYTES + 1);
        } else {
            memcpy(hash, ptr, *size);
            hash[*size] = 0;
        }
        memmove(filename, spacepos + 1, strlen(spacepos));

        *size /= 2;
        return 1;
 nextline:
        if (verbose)
            printf("Skipping line %s\n", filename);
    }
    return 0;
}